

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitorTests.cpp
# Opt level: O2

void __thiscall
PrintVisitorTest_BinaryOperation_Test::TestBody(PrintVisitorTest_BinaryOperation_Test *this)

{
  char *message;
  unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> local_210;
  _Head_base<0UL,_NumericLiteralNode_*,_false> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  AssertionResult gtest_ar;
  string expected;
  PrintVisitor visitor;
  stringstream result;
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&result);
  visitor.stream_ = local_180;
  visitor.super_Visitor._vptr_Visitor = (_func_int **)&PTR__Visitor_001d0320;
  visitor.indentation_ = 0;
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  std::make_unique<NumericLiteralNode,int>((int *)&expected);
  local_210._M_t.super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
  ._M_t.super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>.
  super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl._0_4_ = 0;
  std::make_unique<NumericLiteralNode,int>((int *)&local_200);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)&local_208,
             (BinaryOperator *)&expected,&local_210);
  if ((long *)local_200._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_200._M_dataplus._M_p + 8))();
  }
  if (expected._M_dataplus._M_p != (pointer)0x0) {
    (**(code **)(*(long *)expected._M_dataplus._M_p + 8))();
  }
  (*((local_208._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[2])
            (local_208._M_head_impl,&visitor);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expected,"BinaryOpNode:\n NumericLiteral: 1\nAddition\n NumericLiteral: 2\n"
             ,(allocator<char> *)&local_200);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"result.str()","expected",&local_200,&expected);
  std::__cxx11::string::~string((string *)&local_200);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_200);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kamilsan[P]lazy-interpreted-language/tests/PrintVisitorTests.cpp"
               ,0x25,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_210,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_210);
    if ((long *)local_200._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_200._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&expected);
  if (local_208._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((local_208._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&result);
  return;
}

Assistant:

TEST(PrintVisitorTest, BinaryOperation)
{
  std::stringstream result;
  PrintVisitor visitor{result};
  auto node = std::make_unique<BinaryOpNode>(std::make_unique<NumericLiteralNode>(1), BinaryOperator::Addition, std::make_unique<NumericLiteralNode>(2));
  node->accept(visitor);

  std::string expected{"BinaryOpNode:\n NumericLiteral: 1\nAddition\n NumericLiteral: 2\n"};
  EXPECT_EQ(result.str(), expected);
}